

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

void __thiscall
fasttext::ProductQuantizer::kmeans(ProductQuantizer *this,real *x,real *c,int32_t n,int32_t d)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  reference pvVar1;
  ProductQuantizer *this_00;
  int in_ECX;
  int iVar2;
  real *in_RDX;
  allocator_type *in_RSI;
  long in_RDI;
  int in_R8D;
  int i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> codes;
  int i;
  vector<int,_std::allocator<int>_> perm;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffef8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff00;
  real *prVar3;
  allocator_type *in_stack_ffffffffffffff08;
  uint8_t *codes_00;
  allocator_type *in_stack_ffffffffffffff10;
  real *in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  int local_98;
  uint8_t local_90 [28];
  int local_74;
  int *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int32_t in_stack_ffffffffffffffb0;
  int32_t in_stack_ffffffffffffffb4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  real *in_stack_ffffffffffffffc8;
  ProductQuantizer *in_stack_ffffffffffffffd0;
  
  uVar4 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1e23b5);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18,
             (value_type_conflict *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::allocator<int>::~allocator((allocator<int> *)0x1e23e3);
  local_58 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffef8._M_current);
  local_60 = (int *)std::vector<int,_std::allocator<int>_>::end
                              (in_stack_fffffffffffffef8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,0);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffef8._M_current);
  local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                              (in_stack_fffffffffffffef8._M_current);
  __first._M_current._4_4_ = uVar4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffc0;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            (__first,in_stack_ffffffffffffffb8,
             (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_74 = 0; local_74 < *(int *)(in_RDI + 4); local_74 = local_74 + 1) {
    iVar2 = local_74 * in_R8D;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffc8,(long)local_74
                       );
    memcpy(in_RDX + iVar2,in_RSI + (long)(*pvVar1 * in_R8D) * 4,(long)in_R8D << 2);
  }
  this_00 = (ProductQuantizer *)(long)in_ECX;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1e257b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,
             (size_type)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1e259b);
  for (local_98 = 0; local_98 < *(int *)(in_RDI + 0x14); local_98 = local_98 + 1) {
    codes_00 = local_90;
    prVar3 = in_RDX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e25dd);
    Estep(this_00,in_stack_ffffffffffffff18,(real *)in_stack_ffffffffffffff10,codes_00,
          (int32_t)((ulong)prVar3 >> 0x20),(int32_t)prVar3);
    in_stack_ffffffffffffff10 = in_RSI;
    in_stack_ffffffffffffff18 = in_RDX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e2627);
    MStep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
          (real *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
          (uint8_t *)in_stack_ffffffffffffffb8._M_current,in_stack_ffffffffffffffb4,
          in_stack_ffffffffffffffb0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void ProductQuantizer::kmeans(const real* x, real* c, int32_t n, int32_t d) {
  std::vector<int32_t> perm(n, 0);
  std::iota(perm.begin(), perm.end(), 0);
  std::shuffle(perm.begin(), perm.end(), rng);
  for (auto i = 0; i < ksub_; i++) {
    memcpy(&c[i * d], x + perm[i] * d, d * sizeof(real));
  }
  auto codes = std::vector<uint8_t>(n);
  for (auto i = 0; i < niter_; i++) {
    Estep(x, c, codes.data(), d, n);
    MStep(x, c, codes.data(), d, n);
  }
}